

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  unsigned_short *puVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImFontGlyph *pIVar13;
  ImFontGlyph *pIVar14;
  ulong uVar15;
  char *__function;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  
  uVar19 = (this->Glyphs).Size;
  if ((ulong)uVar19 == 0) {
    uVar23 = 0;
  }
  else {
    lVar16 = 0;
    uVar21 = 0;
    if (0 < (int)uVar19) {
      uVar21 = uVar19;
    }
    uVar23 = 0;
    do {
      if (uVar21 <= uVar19 - 1) {
        __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
        goto LAB_00166760;
      }
      uVar22 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar16) & 0x7fffffff;
      if (uVar22 < uVar23) {
        uVar22 = uVar23;
      }
      uVar23 = uVar22;
      lVar16 = lVar16 + 0x28;
    } while ((ulong)uVar19 * 0x28 != lVar16);
  }
  if (0xfffe < (int)uVar19) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0xa47,"void ImFont::BuildLookupTable()");
  }
  pfVar5 = (this->IndexAdvanceX).Data;
  if (pfVar5 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar5);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar6 = (this->IndexLookup).Data;
  if (puVar6 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar6);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar23 + 1);
  iVar2 = (this->Glyphs).Size;
  lVar16 = (long)iVar2;
  if (0 < lVar16) {
    iVar3 = (this->IndexAdvanceX).Size;
    pfVar5 = (this->IndexAdvanceX).Data;
    iVar4 = (this->IndexLookup).Size;
    puVar6 = (this->IndexLookup).Data;
    pfVar17 = &((this->Glyphs).Data)->AdvanceX;
    lVar20 = 0;
    do {
      uVar19 = *(uint *)(pfVar17 + -1);
      uVar21 = uVar19 & 0x7fffffff;
      if (iVar3 <= (int)uVar21) goto LAB_0016671d;
      pfVar5[uVar21] = *pfVar17;
      if (iVar4 <= (int)uVar21) goto LAB_00166734;
      puVar6[uVar21] = (unsigned_short)lVar20;
      this->Used4kPagesMap[uVar21 >> 0xf] =
           this->Used4kPagesMap[uVar21 >> 0xf] | (byte)(1 << ((byte)(uVar19 >> 0xc) & 7));
      lVar20 = lVar20 + 1;
      pfVar17 = pfVar17 + 10;
    } while (lVar16 != lVar20);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar14 = this->FallbackGlyph;
  }
  else {
    pIVar14 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar14 == (ImFontGlyph *)0x0) {
LAB_00166640:
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar14 = this->FallbackGlyph;
    }
    else {
      pIVar14 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar14 != (ImFontGlyph *)0x0) {
      pIVar14->field_0x3 = pIVar14->field_0x3 & 0x7f;
    }
    if (((uint)(this->IndexLookup).Size < 10) ||
       (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
      pIVar14 = this->FallbackGlyph;
    }
    else {
      pIVar14 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar14 != (ImFontGlyph *)0x0) {
      pIVar14->field_0x3 = pIVar14->field_0x3 & 0x7f;
    }
    if ((ulong)this->FallbackChar < (ulong)(long)(this->IndexLookup).Size) {
      uVar1 = (this->IndexLookup).Data[this->FallbackChar];
      pIVar14 = (ImFontGlyph *)0x0;
      if (uVar1 != 0xffff) {
        pIVar14 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
      }
    }
    else {
      pIVar14 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar14;
    fVar24 = 0.0;
    if (pIVar14 != (ImFontGlyph *)0x0) {
      fVar24 = pIVar14->AdvanceX;
    }
    this->FallbackAdvanceX = fVar24;
    uVar19 = (this->IndexAdvanceX).Size;
    pfVar5 = (this->IndexAdvanceX).Data;
    uVar18 = 0;
    uVar15 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar15 = uVar18;
    }
    while (uVar15 != uVar18) {
      pfVar17 = pfVar5 + uVar18;
      if (*pfVar17 <= 0.0 && *pfVar17 != 0.0) {
        pfVar5[uVar18] = this->FallbackAdvanceX;
      }
      uVar18 = uVar18 + 1;
      if (uVar23 + 1 == uVar18) {
        return;
      }
    }
  }
  else {
    if (iVar2 < 1) {
LAB_0016676a:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    if (((undefined1  [40])(this->Glyphs).Data[lVar16 + -1] & (undefined1  [40])0x7fffffff) !=
        (undefined1  [40])0x9) {
      uVar19 = iVar2 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= iVar2) {
        if (iVar3 == 0) {
          uVar21 = 8;
        }
        else {
          uVar21 = iVar3 / 2 + iVar3;
        }
        if ((int)uVar21 <= (int)uVar19) {
          uVar21 = uVar19;
        }
        if (iVar3 < (int)uVar21) {
          pIVar13 = (ImFontGlyph *)ImGui::MemAlloc((ulong)uVar21 * 0x28);
          pIVar14 = (this->Glyphs).Data;
          if (pIVar14 != (ImFontGlyph *)0x0) {
            memcpy(pIVar13,pIVar14,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar13;
          (this->Glyphs).Capacity = uVar21;
        }
      }
      (this->Glyphs).Size = uVar19;
    }
    lVar16 = (long)(this->Glyphs).Size;
    if (lVar16 < 1) goto LAB_0016676a;
    pIVar14 = (this->Glyphs).Data;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    fVar24 = pIVar13->V1;
    pIVar14[lVar16 + -1].U1 = pIVar13->U1;
    pIVar14[lVar16 + -1].V1 = fVar24;
    uVar9 = *(undefined4 *)&pIVar13->field_0x0;
    fVar10 = pIVar13->AdvanceX;
    fVar11 = pIVar13->X0;
    fVar12 = pIVar13->Y0;
    fVar24 = pIVar13->Y1;
    fVar7 = pIVar13->U0;
    fVar8 = pIVar13->V0;
    pIVar14[lVar16 + -1].X1 = pIVar13->X1;
    pIVar14[lVar16 + -1].Y1 = fVar24;
    pIVar14[lVar16 + -1].U0 = fVar7;
    pIVar14[lVar16 + -1].V0 = fVar8;
    *(undefined4 *)&pIVar14[lVar16 + -1].field_0x0 = uVar9;
    pIVar14[lVar16 + -1].AdvanceX = fVar10;
    pIVar14[lVar16 + -1].X0 = fVar11;
    pIVar14[lVar16 + -1].Y0 = fVar12;
    *(uint *)(pIVar14 + lVar16 + -1) = *(uint *)(pIVar14 + lVar16 + -1) & 0x80000000 | 9;
    fVar24 = pIVar14[lVar16 + -1].AdvanceX * 4.0;
    pIVar14[lVar16 + -1].AdvanceX = fVar24;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar24;
      if ((this->IndexLookup).Size <= (int)(*(uint *)(pIVar14 + lVar16 + -1) & 0x7fffffff)) {
LAB_00166734:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00166760;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar14 + lVar16 + -1) & 0x7fffffff] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_00166640;
    }
  }
LAB_0016671d:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00166760:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x52e,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}